

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsimd.c
# Opt level: O2

int jsimd_can_encode_mcu_AC_refine_prepare(void)

{
  init_simd();
  return simd_support >> 3 & 1;
}

Assistant:

GLOBAL(int)
jsimd_can_encode_mcu_AC_refine_prepare(void)
{
  init_simd();

  if (DCTSIZE != 8)
    return 0;
  if (sizeof(JCOEF) != 2)
    return 0;
  if (simd_support & JSIMD_SSE2)
    return 1;

  return 0;
}